

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ifc.cc
# Opt level: O3

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Iifc::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Iifc *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  pointer ppSVar2;
  MthdIfcSize *pMVar3;
  MthdVtxXy *pMVar4;
  SingleMthdTest *this_01;
  result_type rVar5;
  Test *pTVar6;
  MthdDmaGrobj *this_02;
  MthdCtxSurf2D *this_03;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_441;
  vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>> *local_440
  ;
  MthdIfcSize *local_438;
  MthdIfcSize *local_430;
  MthdVtxXy *local_428;
  Test *local_420;
  Test *local_418;
  Test *local_410;
  Test *local_408;
  Test *local_400;
  Test *local_3f8;
  Test *local_3f0;
  Test *local_3e8;
  Test *local_3e0;
  Test *local_3d8;
  Test *local_3d0;
  Test *local_3c8;
  Test *local_3c0;
  long local_3b8;
  undefined1 local_3b0 [48];
  undefined1 *local_380;
  long local_378;
  undefined1 local_370 [16];
  undefined1 *local_360;
  long local_358;
  undefined1 local_350 [16];
  undefined1 *local_340;
  long local_338;
  undefined1 local_330 [16];
  undefined1 *local_320;
  long local_318;
  undefined1 local_310 [16];
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0 [16];
  undefined1 *local_2e0;
  long local_2d8;
  undefined1 local_2d0 [16];
  undefined1 *local_2c0;
  long local_2b8;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0;
  long local_298;
  undefined1 local_290 [16];
  undefined1 *local_280;
  long local_278;
  undefined1 local_270 [16];
  undefined1 *local_260;
  long local_258;
  undefined1 local_250 [16];
  undefined1 *local_240;
  long local_238;
  undefined1 local_230 [16];
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  undefined1 *local_200;
  long local_1f8;
  undefined1 local_1f0 [16];
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  SingleMthdTest *local_e0;
  Test *local_d8;
  Test *local_d0;
  Test *local_c8;
  Test *local_c0;
  MthdDmaGrobj *local_b8;
  Test *local_b0;
  Test *local_a8;
  Test *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  MthdCtxSurf2D *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  MthdVtxXy *local_50;
  MthdIfcSize *local_48;
  MthdIfcSize *local_40;
  Test *local_38;
  
  local_440 = (vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
               *)__return_storage_ptr__;
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_3b0._40_8_ = this_01;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3c0 = (Test *)local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar5);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this_01->name,local_3c0,(long)(local_3c0->rnd)._M_x + local_3b8 + -8);
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356aa0;
  local_e0 = this_01;
  pTVar6 = (Test *)operator_new(0x25950);
  local_3b0._32_8_ = pTVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_1c0,local_1c0 + local_1b8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356c90;
  local_d8 = pTVar6;
  local_3c8 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"patch","");
  pTVar6 = local_3c8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3c8,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x10c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_1e0,local_1e0 + local_1d8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357830;
  local_d0 = pTVar6;
  local_3d0 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"pm_trigger","");
  pTVar6 = local_3d0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3d0,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_200,local_200 + local_1f8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358ad0;
  local_c8 = pTVar6;
  local_3d8 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"dma_notify","");
  pTVar6 = local_3d8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3d8,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 1;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_220,local_220 + local_218);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357928;
  local_c0 = pTVar6;
  this_02 = (MthdDmaGrobj *)operator_new(0x25960);
  local_3b0._24_8_ = this_02;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"dma_palette","");
  MthdDmaGrobj::MthdDmaGrobj
            (this_02,opt,(uint32_t)rVar5,&local_100,2,(this->super_Class).cls,0x184,0,0);
  local_b8 = this_02;
  local_3e0 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"ctx_chroma","");
  pTVar6 = local_3e0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3e0,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x188;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 3;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_240,local_240 + local_238);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357260;
  *(undefined1 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 1;
  local_b0 = pTVar6;
  local_3e8 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"ctx_clip","");
  pTVar6 = local_3e8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3e8,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x18c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 4;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_260,local_260 + local_258);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357a20;
  local_a8 = pTVar6;
  local_3f0 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ctx_pattern","");
  pTVar6 = local_3f0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3f0,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 400;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 5;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_280,local_280 + local_278);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357358;
  *(undefined1 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 1;
  local_a0 = pTVar6;
  local_3f8 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"ctx_rop","");
  pTVar6 = local_3f8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3f8,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x194;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 6;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_2a0,local_2a0 + local_298);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357b18;
  local_98 = pTVar6;
  local_400 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ctx_beta","");
  pTVar6 = local_400;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_400,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x198;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 7;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_2c0,local_2c0 + local_2b8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357c10;
  local_90 = pTVar6;
  local_408 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"ctx_beta4","");
  pTVar6 = local_408;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_408,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x19c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 8;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_2e0,local_2e0 + local_2d8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357d08;
  local_88 = pTVar6;
  this_03 = (MthdCtxSurf2D *)operator_new(0x25958);
  local_3b0._16_8_ = this_03;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"ctx_surf2d","");
  uVar1 = (this->super_Class).cls;
  MthdCtxSurf2D::MthdCtxSurf2D
            (this_03,opt,(uint32_t)rVar5,&local_120,9,uVar1,0x1a0,uVar1 != 0x60 | 2);
  local_80 = this_03;
  local_410 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"missing","");
  pTVar6 = local_410;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_410,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_300,local_300 + local_2f8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358790;
  local_78 = pTVar6;
  local_418 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"operation","");
  pTVar6 = local_418;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_418,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x3e4;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 10;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_320,local_320 + local_318);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357168;
  *(undefined1 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 1;
  local_70 = pTVar6;
  local_420 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"format","");
  pTVar6 = local_420;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_420,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 1000;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_340,local_340 + local_338);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035b3c8;
  *(undefined1 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 1;
  local_68 = pTVar6;
  pTVar6 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"index_format","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x3ec;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_360,local_360 + local_358);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035b7a8;
  local_60 = pTVar6;
  pTVar6 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_380 = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"palette_offset","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x3f0;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xd;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_380,local_380 + local_378);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035b8a0;
  local_58 = pTVar6;
  local_428 = (MthdVtxXy *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"xy","");
  pMVar4 = local_428;
  MthdVtxXy::MthdVtxXy
            (local_428,opt,(uint32_t)rVar5,&local_140,0xe,(this->super_Class).cls,0x3f4,1,4,0x21);
  local_50 = pMVar4;
  local_430 = (MthdIfcSize *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"size_out","");
  pMVar3 = local_430;
  MthdIfcSize::MthdIfcSize
            (local_430,opt,(uint32_t)rVar5,&local_160,0xf,(this->super_Class).cls,0x3f8,4);
  local_48 = pMVar3;
  local_438 = (MthdIfcSize *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"size_in","");
  pMVar3 = local_438;
  MthdIfcSize::MthdIfcSize
            (local_438,opt,(uint32_t)rVar5,&local_180,0x10,(this->super_Class).cls,0x3fc,2);
  local_40 = pMVar3;
  pTVar6 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"iifc_data","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x400;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 0x700;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_1a0,local_1a0 + local_198);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035b998;
  __l._M_len = 0x16;
  __l._M_array = &local_e0;
  local_38 = pTVar6;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector((vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)local_440,__l,&local_441);
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  if (local_360 != local_350) {
    operator_delete(local_360);
  }
  if (local_340 != local_330) {
    operator_delete(local_340);
  }
  if (local_320 != local_310) {
    operator_delete(local_320);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  if (local_280 != local_270) {
    operator_delete(local_280);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_3c0 != (Test *)local_3b0) {
    operator_delete(local_3c0);
  }
  if ((char)(this->super_Class).cls == 'd') {
    ppSVar2 = *(pointer *)(local_440 + 8);
    pTVar6 = (Test *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_e0 = (SingleMthdTest *)&stack0xffffffffffffff30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"dither","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar6,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x3e0;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0x12;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_e0,
               (long)(local_e0->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd._M_x
               + (long)(&local_d8->rnd + -1) + 0x1378U);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357738;
    local_3c0 = pTVar6;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>(local_440,ppSVar2,&local_3c0);
    if (local_e0 != (SingleMthdTest *)&stack0xffffffffffffff30) {
      operator_delete(local_e0);
    }
  }
  return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)local_440;
}

Assistant:

std::vector<SingleMthdTest *> Iifc::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_palette", 2, cls, 0x184, 0, DMA_R),
		new MthdCtxChroma(opt, rnd(), "ctx_chroma", 3, cls, 0x188, true),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 4, cls, 0x18c),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 5, cls, 0x190, true),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 6, cls, 0x194),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 7, cls, 0x198),
		new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 8, cls, 0x19c),
		new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 9, cls, 0x1a0, (cls == 0x60 ? SURF2D_NV4 : SURF2D_NV10) | SURF2D_SWZOK),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 10, cls, 0x3e4, true),
		new MthdIfcFormat(opt, rnd(), "format", 11, cls, 0x3e8, true),
		new MthdIndexFormat(opt, rnd(), "index_format", 12, cls, 0x3ec),
		new MthdPaletteOffset(opt, rnd(), "palette_offset", 13, cls, 0x3f0),
		new MthdVtxXy(opt, rnd(), "xy", 14, cls, 0x3f4, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdIfcSize(opt, rnd(), "size_out", 15, cls, 0x3f8, IFC_OUT),
		new MthdIfcSize(opt, rnd(), "size_in", 16, cls, 0x3fc, IFC_IN),
		new MthdIifcData(opt, rnd(), "iifc_data", 17, cls, 0x400, 0x700),
	};
	if ((cls & 0xff) == 0x64) {
		res.insert(res.end(), {
			new MthdDither(opt, rnd(), "dither", 18, cls, 0x3e0),
		});
	}
	return res;
}